

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool testing::internal::MatchPrintAndExplain<int_const,int_const&>
               (int *value,Matcher<const_int_&> *matcher,MatchResultListener *listener)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  type_info *type;
  StringMatchResultListener inner_listener;
  string local_208;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (listener->stream_ != (ostream *)0x0) {
    local_1c8.stream_ = local_1a8;
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0057f2e8;
    std::__cxx11::stringstream::stringstream(local_1b8);
    bVar1 = MatcherBase<const_int_&>::MatchAndExplain
                      (&matcher->super_MatcherBase<const_int_&>,value,&local_1c8);
    std::ostream::operator<<(listener->stream_,*value);
    GetTypeName_abi_cxx11_(&local_208,(internal *)&int::typeinfo,type);
    if ((local_208._M_string_length < 0x15) ||
       (lVar2 = std::__cxx11::string::find_first_of((char *)&local_208,0x39b857,0), lVar2 == -1)) {
      poVar3 = listener->stream_;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," (of type ",10);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    }
    std::__cxx11::stringbuf::str();
    poVar3 = listener->stream_;
    if ((poVar3 != (ostream *)0x0) && (local_1e0 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0057f2e8;
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    return bVar1;
  }
  local_1c8.stream_ = (ostream *)0x0;
  local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_0057f280;
  bVar1 = MatcherBase<const_int_&>::MatchAndExplain
                    (&matcher->super_MatcherBase<const_int_&>,value,&local_1c8);
  return bVar1;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}